

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O0

void __thiscall HistoryBuffer::Feed(HistoryBuffer *this,float sample)

{
  int local_18;
  int w;
  float sample_local;
  HistoryBuffer *this_local;
  
  local_18 = this->writeindex + 1;
  if (local_18 == this->length) {
    local_18 = 0;
  }
  this->data[local_18] = sample;
  this->writeindex = local_18;
  return;
}

Assistant:

inline void Feed(float sample)
    {
        // Don't try to optimize this with ++
        // The writeindex veriable may be read at the same time, so we don't want intermediate values indexing out of the array.
        int w = writeindex + 1;
        if (w == length)
            w = 0;
        data[w] = sample;
        writeindex = w;
    }